

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

size_t __thiscall
UdpSocket::Implementation::ReceiveFrom
          (Implementation *this,IpEndpointName *remoteEndpoint,char *data,size_t size)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ssize_t result;
  undefined1 local_40 [4];
  socklen_t fromAddrLen;
  sockaddr_in fromAddr;
  size_t size_local;
  char *data_local;
  IpEndpointName *remoteEndpoint_local;
  Implementation *this_local;
  
  fromAddr.sin_zero = (uchar  [8])size;
  if ((this->isBound_ & 1U) != 0) {
    result._4_4_ = 0x10;
    this_local = (Implementation *)
                 recvfrom(this->socket_,data,size,0,(sockaddr *)local_40,
                          (socklen_t *)((long)&result + 4));
    if ((long)this_local < 0) {
      this_local = (Implementation *)0x0;
    }
    else {
      uVar2 = ntohl(fromAddrLen);
      remoteEndpoint->address = (ulong)uVar2;
      uVar1 = ntohs(local_40._2_2_);
      remoteEndpoint->port = (uint)uVar1;
    }
    return (size_t)this_local;
  }
  __assert_fail("isBound_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/ip/posix/UdpSocket.cpp"
                ,0xe9,
                "std::size_t UdpSocket::Implementation::ReceiveFrom(IpEndpointName &, char *, std::size_t)"
               );
}

Assistant:

std::size_t ReceiveFrom( IpEndpointName& remoteEndpoint, char *data, std::size_t size )
	{
		assert( isBound_ );

		struct sockaddr_in fromAddr;
        socklen_t fromAddrLen = sizeof(fromAddr);
             	 
        ssize_t result = recvfrom(socket_, data, size, 0,
                    (struct sockaddr *) &fromAddr, (socklen_t*)&fromAddrLen);
		if( result < 0 )
			return 0;

		remoteEndpoint.address = ntohl(fromAddr.sin_addr.s_addr);
		remoteEndpoint.port = ntohs(fromAddr.sin_port);

		return (std::size_t)result;
	}